

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O3

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  double dVar1;
  int iVar2;
  connectdata *pcVar3;
  char *pcVar4;
  curl_socket_t cVar5;
  curl_sslbackend cVar6;
  long lVar7;
  curl_slist *pcVar8;
  char *pcVar9;
  curl_tlssessioninfo **tsip;
  CURLcode CVar10;
  va_list arg;
  double *local_c8;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_UNKNOWN_OPTION;
  }
  CVar10 = CURLE_UNKNOWN_OPTION;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x10001e) {
      if (info == CURLINFO_EFFECTIVE_URL) {
        pcVar4 = (data->change).url;
        pcVar9 = "";
        if (pcVar4 != (char *)0x0) {
          pcVar9 = pcVar4;
        }
      }
      else if (info == CURLINFO_CONTENT_TYPE) {
        pcVar9 = (data->info).contenttype;
      }
      else {
        if (info != CURLINFO_PRIVATE) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar9 = (char *)(data->set).private_data;
      }
    }
    else {
      switch(info) {
      case CURLINFO_FTP_ENTRY_PATH:
        pcVar9 = (data->state).most_recent_ftp_entrypath;
        break;
      case CURLINFO_REDIRECT_URL:
        pcVar9 = (data->info).wouldredirect;
        break;
      case CURLINFO_PRIMARY_IP:
        pcVar9 = (data->info).conn_primary_ip;
        break;
      case 0x100021:
      case 0x100022:
      case 0x100023:
      case 0x100025:
      case 0x100026:
      case 0x100027:
      case 0x100028:
        goto switchD_0051c1ca_default;
      case CURLINFO_RTSP_SESSION_ID:
        pcVar9 = (data->set).str[0x2f];
        break;
      case CURLINFO_LOCAL_IP:
        pcVar9 = (data->info).conn_local_ip;
        break;
      default:
        if (info != CURLINFO_SCHEME) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar9 = (data->info).conn_scheme;
      }
    }
    *local_c8 = (double)pcVar9;
    break;
  case 1:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_RESPONSE_CODE:
      pcVar8 = (curl_slist *)(long)(data->info).httpcode;
      break;
    default:
      goto switchD_0051c1ca_default;
    case CURLINFO_HEADER_SIZE:
      pcVar8 = (curl_slist *)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      pcVar8 = (curl_slist *)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      pcVar8 = (curl_slist *)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      pcVar8 = (curl_slist *)(data->info).filetime;
      break;
    case CURLINFO_REDIRECT_COUNT:
      pcVar8 = (curl_slist *)(data->set).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      pcVar8 = (curl_slist *)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      pcVar8 = (curl_slist *)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      pcVar8 = (curl_slist *)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      pcVar8 = (curl_slist *)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      pcVar8 = (curl_slist *)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar5 = Curl_getconnectinfo(data,(connectdata **)0x0);
      pcVar8 = (curl_slist *)(long)cVar5;
      break;
    case CURLINFO_CONDITION_UNMET:
      pcVar8 = (curl_slist *)(ulong)(data->info).timecond;
      break;
    case CURLINFO_RTSP_CLIENT_CSEQ:
      pcVar8 = (curl_slist *)(data->state).rtsp_next_client_CSeq;
      break;
    case CURLINFO_RTSP_SERVER_CSEQ:
      pcVar8 = (curl_slist *)(data->state).rtsp_next_server_CSeq;
      break;
    case CURLINFO_RTSP_CSEQ_RECV:
      pcVar8 = (curl_slist *)(data->state).rtsp_CSeq_recv;
      break;
    case CURLINFO_PRIMARY_PORT:
      pcVar8 = (curl_slist *)(data->info).conn_primary_port;
      break;
    case CURLINFO_LOCAL_PORT:
      pcVar8 = (curl_slist *)(data->info).conn_local_port;
      break;
    case CURLINFO_HTTP_VERSION:
      iVar2 = (data->info).httpversion;
      if (iVar2 == 10) {
        pcVar8 = (curl_slist *)0x1;
      }
      else if (iVar2 == 0x14) {
        pcVar8 = (curl_slist *)0x3;
      }
      else if (iVar2 == 0xb) {
        pcVar8 = (curl_slist *)0x2;
      }
      else {
        pcVar8 = (curl_slist *)0x0;
      }
      break;
    case CURLINFO_PROXY_SSL_VERIFYRESULT:
      pcVar8 = (curl_slist *)(data->set).proxy_ssl.certverifyresult;
      break;
    case CURLINFO_PROTOCOL:
      pcVar8 = (curl_slist *)(ulong)(data->info).conn_protocol;
    }
LAB_0051c6fb:
    *local_c8 = (double)pcVar8;
    break;
  case 2:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_TOTAL_TIME:
      dVar1 = (data->progress).timespent;
      break;
    case CURLINFO_NAMELOOKUP_TIME:
      dVar1 = (data->progress).t_nslookup;
      break;
    case CURLINFO_CONNECT_TIME:
      dVar1 = (data->progress).t_connect;
      break;
    case CURLINFO_PRETRANSFER_TIME:
      dVar1 = (data->progress).t_pretransfer;
      break;
    case CURLINFO_SIZE_UPLOAD:
      dVar1 = (double)(data->progress).uploaded;
      break;
    case CURLINFO_SIZE_DOWNLOAD:
      dVar1 = (double)(data->progress).downloaded;
      break;
    case CURLINFO_SPEED_DOWNLOAD:
      dVar1 = (double)(data->progress).dlspeed;
      break;
    case CURLINFO_SPEED_UPLOAD:
      dVar1 = (double)(data->progress).ulspeed;
      break;
    default:
      goto switchD_0051c1ca_default;
    case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
      if (((data->progress).flags & 0x40) == 0) {
LAB_0051c5da:
        dVar1 = -1.0;
      }
      else {
        dVar1 = (double)(data->progress).size_dl;
      }
      break;
    case CURLINFO_CONTENT_LENGTH_UPLOAD:
      if (((data->progress).flags & 0x20) == 0) goto LAB_0051c5da;
      dVar1 = (double)(data->progress).size_ul;
      break;
    case CURLINFO_STARTTRANSFER_TIME:
      dVar1 = (data->progress).t_starttransfer;
      break;
    case CURLINFO_REDIRECT_TIME:
      dVar1 = (data->progress).t_redirect;
      break;
    case CURLINFO_APPCONNECT_TIME:
      dVar1 = (data->progress).t_appconnect;
    }
    *local_c8 = dVar1;
    break;
  case 3:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x400022) {
      if (info == CURLINFO_SSL_ENGINES) {
        pcVar8 = Curl_ssl_engines_list(data);
      }
      else {
        if (info != CURLINFO_COOKIELIST) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar8 = Curl_cookie_list(data);
      }
      goto LAB_0051c6fb;
    }
    if (info != CURLINFO_CERTINFO) {
      if ((info != CURLINFO_TLS_SESSION) && (info != CURLINFO_TLS_SSL_PTR)) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar3 = data->easy_conn;
      *local_c8 = (double)&data->tsi;
      cVar6 = Curl_ssl_backend();
      (data->tsi).backend = cVar6;
      (data->tsi).internals = (void *)0x0;
      if (cVar6 == CURLSSLBACKEND_NONE || pcVar3 == (connectdata *)0x0) {
        return CURLE_OK;
      }
      lVar7 = 0x290;
      if ((pcVar3->ssl[0].use == false) && (lVar7 = 0x2b8, pcVar3->ssl[1].use != true)) {
        return CURLE_OK;
      }
      (data->tsi).internals =
           *(void **)((pcVar3->chunk).hexbuffer +
                     (ulong)(info != CURLINFO_TLS_SESSION) * 8 + lVar7 + -0x10);
      return CURLE_OK;
    }
    *local_c8 = (double)&(data->info).certs;
    break;
  case 4:
    if ((info == CURLINFO_ACTIVESOCKET) && (local_c8 != (double *)0x0)) {
      CVar10 = CURLE_OK;
      cVar5 = Curl_getconnectinfo(data,(connectdata **)0x0);
      *(curl_socket_t *)local_c8 = cVar5;
    }
  default:
    goto switchD_0051c1ca_default;
  }
  CVar10 = CURLE_OK;
switchD_0051c1ca_default:
  return CVar10;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return result;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}